

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O0

int curl_mvsnprintf(char *buffer,size_t maxlength,char *format,__va_list_tag *ap_save)

{
  char *local_48;
  nsprintf info;
  int retcode;
  __va_list_tag *ap_save_local;
  char *format_local;
  size_t maxlength_local;
  char *buffer_local;
  
  info.buffer = (char *)0x0;
  local_48 = buffer;
  info.length = maxlength;
  info.max._4_4_ = formatf(&local_48,addbyter,format,ap_save);
  if (info.length != 0) {
    if ((char *)info.length == info.buffer) {
      local_48[-1] = '\0';
      info.max._4_4_ = info.max._4_4_ + -1;
    }
    else {
      *local_48 = '\0';
    }
  }
  return info.max._4_4_;
}

Assistant:

int curl_mvsnprintf(char *buffer, size_t maxlength, const char *format,
                    va_list ap_save)
{
  int retcode;
  struct nsprintf info;

  info.buffer = buffer;
  info.length = 0;
  info.max = maxlength;

  retcode = formatf(&info, addbyter, format, ap_save);
  if(info.max) {
    /* we terminate this with a zero byte */
    if(info.max == info.length) {
      /* we're at maximum, scrap the last letter */
      info.buffer[-1] = 0;
      DEBUGASSERT(retcode);
      retcode--; /* don't count the nul byte */
    }
    else
      info.buffer[0] = 0;
  }
  return retcode;
}